

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * __thiscall
testing::GetDirFromEnv_abi_cxx11_
          (string *__return_storage_ptr__,testing *this,
          initializer_list<const_char_*> environment_variables,char *fallback,char separator)

{
  string *psVar1;
  char *__s;
  size_t sVar2;
  long *plVar3;
  long lVar4;
  bool bVar5;
  long *local_60;
  ulong local_58;
  long local_50 [2];
  char *local_40;
  string *local_38;
  
  local_40 = (char *)environment_variables._M_len;
  bVar5 = environment_variables._M_array == (iterator)0x0;
  local_38 = __return_storage_ptr__;
  if (!bVar5) {
    lVar4 = 0;
    do {
      __s = getenv(*(char **)(this + lVar4));
      if ((__s != (char *)0x0) && (*__s != '\0')) {
        sVar2 = strlen(__s);
        psVar1 = local_38;
        if (__s[sVar2 - 1] == '/') {
          (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
          sVar2 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)psVar1,__s,__s + sVar2);
        }
        else {
          local_60 = local_50;
          sVar2 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,__s,__s + sVar2);
          plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_60,local_58,0,'\x01');
          (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
          std::__cxx11::string::_M_construct<char*>((string *)local_38,*plVar3,plVar3[1] + *plVar3);
          if (local_60 != local_50) {
            operator_delete(local_60,local_50[0] + 1);
          }
        }
        if (!bVar5) {
          return local_38;
        }
        break;
      }
      lVar4 = lVar4 + 8;
      bVar5 = (long)environment_variables._M_array << 3 == lVar4;
    } while (!bVar5);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,local_40,(allocator<char> *)&local_60);
  return local_38;
}

Assistant:

static std::string GetDirFromEnv(
    std::initializer_list<const char*> environment_variables,
    const char* fallback, char separator) {
  for (const char* variable_name : environment_variables) {
    const char* value = internal::posix::GetEnv(variable_name);
    if (value != nullptr && value[0] != '\0') {
      if (value[strlen(value) - 1] != separator) {
        return std::string(value).append(1, separator);
      }
      return value;
    }
  }
  return fallback;
}